

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRNetInterface.h
# Opt level: O2

int32_t MinVR::VRNetInterface::unpackInt(uchar *bytePtr)

{
  int i;
  long lVar1;
  int toReturn;
  
  toReturn = 0;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    *(uchar *)((long)&toReturn + lVar1) = bytePtr[lVar1];
  }
  return toReturn;
}

Assistant:

static int32_t unpackInt(unsigned char *bytePtr) {
		int toReturn = 0;
		unsigned char *p = (unsigned char *) &toReturn;
		for (int i=0;i<VRNET_SIZEOFINT;i++) {
			int index = i;
			if (!isLittleEndian()) {
				index = VRNET_SIZEOFINT - i - 1;
			}
			p[i] = bytePtr[index];
		}
		return toReturn;
	}